

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::extMul<4ul,unsigned_short,unsigned_int,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Literal *pLVar1;
  uint uVar2;
  uint uVar3;
  Literal *val;
  Literal *this_00;
  long lVar4;
  anon_union_16_5_9943fe1e_for_Literal_0 *this_01;
  bool bVar5;
  undefined1 local_248 [8];
  LaneArray<4UL_*_2> lhs;
  LaneArray<4UL_*_2> rhs;
  LaneArray<4UL> result;
  anon_union_16_5_9943fe1e_for_Literal_0 local_60;
  undefined8 local_50;
  Literal *local_48;
  Literal *local_40;
  Literal *local_38;
  
  local_40 = __return_storage_ptr__;
  getLanes<unsigned_short,8>((LaneArray<8> *)local_248,this,a);
  getLanes<unsigned_short,8>((LaneArray<8> *)&lhs._M_elems[7].type,(wasm *)a,val);
  this_01 = (anon_union_16_5_9943fe1e_for_Literal_0 *)&rhs._M_elems[7].type;
  rhs._M_elems[7].type.id = 0;
  local_38 = (Literal *)&rhs._M_elems[3].type;
  lVar4 = 4;
  this_00 = (Literal *)&lhs._M_elems[3].type;
  while (pLVar1 = local_40, bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    local_48 = this_00;
    uVar2 = Literal::geti32(this_00);
    uVar3 = Literal::geti32(local_38);
    local_60.i32 = (uVar3 & 0xffff) * (uVar2 & 0xffff);
    local_50 = 2;
    if (this_01 != &local_60) {
      Literal::~Literal((Literal *)&this_01->func);
      Literal::Literal((Literal *)&this_01->func,(Literal *)&local_60.func);
    }
    Literal::~Literal((Literal *)&local_60.func);
    this_01 = (anon_union_16_5_9943fe1e_for_Literal_0 *)((long)this_01 + 0x18);
    local_38 = local_38 + 1;
    this_00 = local_48 + 1;
  }
  Literal::Literal(local_40,(LaneArray<4> *)&rhs._M_elems[7].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&rhs._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&lhs._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_248);
  return pLVar1;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}